

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmTestGenerator::EvaluateCommandLineArguments
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmTestGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argv,cmGeneratorExpression *ge,string *config)

{
  pointer pbVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string *psVar4;
  ulong __n;
  pointer pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  undefined1 local_98 [16];
  undefined8 local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  cmTestGenerator *local_68;
  string *local_60;
  string *local_58;
  size_type *local_50;
  size_type local_48;
  size_type local_40;
  undefined8 uStack_38;
  
  pbVar5 = (argv->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (argv->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __n = ((ulong)((long)pbVar1 + (-0x20 - (long)pbVar5)) >> 5) + 1;
  if (pbVar1 == pbVar5) {
    __n = 0;
  }
  local_68 = this;
  local_60 = config;
  local_58 = (string *)ge;
  if (__n >> 0x3a == 0) {
    if (pbVar5 == pbVar1) {
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      local_70 = __gnu_cxx::
                 new_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::allocate((new_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)__return_storage_ptr__,__n,(void *)0x0);
    }
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = local_70;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = local_70 + __n;
    if (pbVar5 != pbVar1) {
      paVar3 = &local_70->field_2;
      do {
        paVar6 = paVar3;
        cmGeneratorExpression::Parse((cmGeneratorExpression *)local_98,local_58);
        local_98._8_8_ = &local_80;
        local_88 = 0;
        local_80._M_local_buf[0] = '\0';
        psVar4 = cmCompiledGeneratorExpression::Evaluate
                           ((cmCompiledGeneratorExpression *)local_98._0_8_,local_68->LG,local_60,
                            false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                            (cmGeneratorExpressionDAGChecker *)0x0,(string *)(local_98 + 8));
        pcVar2 = (psVar4->_M_dataplus)._M_p;
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + psVar4->_M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._8_8_ != &local_80) {
          operator_delete((void *)local_98._8_8_,
                          CONCAT71(local_80._M_allocated_capacity._1_7_,local_80._M_local_buf[0]) +
                          1);
        }
        std::
        unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
        ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                       *)local_98);
        (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar6 + -1))->
        _M_dataplus)._M_p = (pointer)paVar6;
        if (local_50 == &local_40) {
          paVar6->_M_allocated_capacity = local_40;
          *(undefined8 *)((long)paVar6 + 8) = uStack_38;
        }
        else {
          (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar6 + -1))->
          _M_dataplus)._M_p = (pointer)local_50;
          paVar6->_M_allocated_capacity = local_40;
        }
        *(size_type *)((long)paVar6 + -8) = local_48;
        pbVar5 = pbVar5 + 1;
        paVar3 = paVar6 + 2;
      } while (pbVar5 != pbVar1);
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar6 + 1);
    }
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = local_70;
    return __return_storage_ptr__;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

std::vector<std::string> cmTestGenerator::EvaluateCommandLineArguments(
  const std::vector<std::string>& argv, cmGeneratorExpression& ge,
  const std::string& config) const
{
  // Evaluate executable name and arguments
  auto evaluatedRange =
    cmMakeRange(argv).transform([&](const std::string& arg) {
      return ge.Parse(arg)->Evaluate(this->LG, config);
    });

  return { evaluatedRange.begin(), evaluatedRange.end() };
}